

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeduh.c
# Opt level: O2

DUH * make_duh(int32 length,int n_tags,char *(*tags) [2],int n_signals,DUH_SIGTYPE_DESC **desc,
              sigdata_t **sigdata)

{
  char *pcVar1;
  bool bVar2;
  DUH *duh;
  DUH_SIGNAL **ppDVar3;
  DUH_SIGNAL *pDVar4;
  size_t sVar5;
  size_t sVar6;
  char *(*__ptr) [2];
  char *__dest;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  
  duh = (DUH *)malloc(0x20);
  if (duh != (DUH *)0x0) {
    duh->n_signals = n_signals;
    ppDVar3 = (DUH_SIGNAL **)malloc((long)n_signals << 3);
    duh->signal = ppDVar3;
    if (ppDVar3 != (DUH_SIGNAL **)0x0) {
      duh->n_tags = 0;
      duh->tag = (char *(*) [2])0x0;
      uVar7 = 0;
      uVar8 = (ulong)(uint)n_signals;
      if (n_signals < 1) {
        uVar8 = uVar7;
      }
      bVar2 = false;
      for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
        pDVar4 = make_signal(desc[uVar7],sigdata[uVar7]);
        ppDVar3[uVar7] = pDVar4;
        if (pDVar4 == (DUH_SIGNAL *)0x0) {
          bVar2 = true;
        }
      }
      if (bVar2) {
        unload_duh(duh);
        return (DUH *)0x0;
      }
      duh->length = length;
      uVar10 = n_tags * 2;
      lVar9 = 0;
      uVar8 = 0;
      if (0 < n_tags) {
        uVar8 = (ulong)(uint)n_tags;
      }
      for (; uVar8 * 0x10 != lVar9; lVar9 = lVar9 + 0x10) {
        sVar5 = strlen(*(char **)((long)*tags + lVar9));
        sVar6 = strlen(*(char **)((long)*tags + lVar9 + 8));
        uVar10 = uVar10 + (int)sVar6 + (int)sVar5;
      }
      if ((int)uVar10 < 1) {
        return duh;
      }
      __ptr = (char *(*) [2])malloc((long)n_tags << 4);
      duh->tag = __ptr;
      if (__ptr == (char *(*) [2])0x0) {
        return duh;
      }
      __dest = (char *)malloc((ulong)uVar10);
      (*__ptr)[0] = __dest;
      if (__dest == (char *)0x0) {
        free(__ptr);
        duh->tag = (char *(*) [2])0x0;
        return duh;
      }
      duh->n_tags = n_tags;
      for (lVar9 = 0; uVar8 * 0x10 != lVar9; lVar9 = lVar9 + 0x10) {
        *(char **)((long)*__ptr + lVar9) = __dest;
        pcVar1 = *(char **)((long)*tags + lVar9);
        strcpy(__dest,pcVar1);
        sVar5 = strlen(pcVar1);
        *(char **)((long)*__ptr + lVar9 + 8) = __dest + sVar5 + 1;
        pcVar1 = *(char **)((long)*tags + lVar9 + 8);
        strcpy(__dest + sVar5 + 1,pcVar1);
        sVar6 = strlen(pcVar1);
        __dest = __dest + sVar6 + sVar5 + 2;
      }
      return duh;
    }
    free(duh);
  }
  if (n_signals < 1) {
    n_signals = 0;
  }
  for (uVar8 = 0; (uint)n_signals != uVar8; uVar8 = uVar8 + 1) {
    if ((desc[uVar8]->unload_sigdata != (DUH_UNLOAD_SIGDATA)0x0) &&
       (sigdata[uVar8] != (sigdata_t *)0x0)) {
      (*desc[uVar8]->unload_sigdata)(sigdata[uVar8]);
    }
  }
  return (DUH *)0x0;
}

Assistant:

DUH *make_duh(
	int32 length,
	int n_tags,
	const char *const tags[][2],
	int n_signals,
	DUH_SIGTYPE_DESC *desc[],
	sigdata_t *sigdata[]
)
{
	DUH *duh = malloc(sizeof(*duh));
	int i;
	int fail;

	if (duh) {
		duh->n_signals = n_signals;

		duh->signal = malloc(n_signals * sizeof(*duh->signal));

		if (!duh->signal) {
			free(duh);
			duh = NULL;
		}
	}

	if (!duh) {
		for (i = 0; i < n_signals; i++)
			if (desc[i]->unload_sigdata)
				if (sigdata[i])
					(*desc[i]->unload_sigdata)(sigdata[i]);
		return NULL;
	}

	duh->n_tags = 0;
	duh->tag = NULL;

	fail = 0;

	for (i = 0; i < n_signals; i++) {
		duh->signal[i] = make_signal(desc[i], sigdata[i]);
		if (!duh->signal[i])
			fail = 1;
	}

	if (fail) {
		unload_duh(duh);
		return NULL;
	}

	duh->length = length;

	{
		int mem = n_tags * 2; /* account for NUL terminators here */
		char *ptr;

		for (i = 0; i < n_tags; i++)
			mem += (int)(strlen(tags[i][0]) + strlen(tags[i][1]));

		if (mem <= 0) return duh;

		duh->tag = malloc(n_tags * sizeof(*duh->tag));
		if (!duh->tag) return duh;
		duh->tag[0][0] = malloc(mem);
		if (!duh->tag[0][0]) {
			free(duh->tag);
			duh->tag = NULL;
			return duh;
		}
		duh->n_tags = n_tags;
		ptr = duh->tag[0][0];
		for (i = 0; i < n_tags; i++) {
			duh->tag[i][0] = ptr;
			strcpy(ptr, tags[i][0]);
			ptr += strlen(tags[i][0]) + 1;
			duh->tag[i][1] = ptr;
			strcpy(ptr, tags[i][1]);
			ptr += strlen(tags[i][1]) + 1;
		}
	}

	return duh;
}